

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O2

void __thiscall
iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test *this)

{
  iuCodeMessage *this_00;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  iu_uint_max_t expectedSize;
  iuCodeMessage local_200;
  undefined1 local_1d0 [32];
  FilePath file_path;
  Fixed local_190;
  
  expectedSize = 0x100000000;
  iutest::detail::iuFilePath::iuFilePath(&file_path,"./testdata/4gb.bin");
  iutest_ar.m_result = iutest::detail::iuFilePath::FileOrDirectoryExists(&file_path);
  iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  if (iutest_ar.m_result) {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_190.super_Message.m_stream.super_iu_stringstream._0_8_ =
         iutest::internal::posix::FileSizeFromPath("./testdata/4gb.bin");
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&iutest_ar,(internal *)"expectedSize",
               "::iutest::internal::posix::FileSizeFromPath(path)",(char *)&expectedSize,
               (unsigned_long *)&local_190,in_R9);
    if (iutest_ar.m_result != false) goto LAB_0014d3ec;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x80,iutest_ar.m_message._M_dataplus._M_p);
    local_200._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    this_00 = &local_200;
  }
  else {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)&iutest_ar,
               (AssertionResult *)"file_path.FileOrDirectoryExists()","false","true",(char *)in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x7f,(char *)local_1d0._0_8_);
    local_200._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    this_00 = (iuCodeMessage *)local_1d0;
  }
  std::__cxx11::string::~string((string *)this_00);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0014d3ec:
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&file_path);
  return;
}

Assistant:

IUTEST(StdFileUnitTest, FileSizeFromPath)
{
    const ::iutest::iu_uint_max_t expectedSize = 0x100000000ull;
    const char* path = "./testdata/4gb.bin";
    ::iutest::internal::FilePath file_path = ::iutest::internal::FilePath(path);
    IUTEST_ASSUME_TRUE (file_path.FileOrDirectoryExists());
    IUTEST_ASSERT_EQ(expectedSize, ::iutest::internal::posix::FileSizeFromPath(path));
}